

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall HEkkDualRow::updateDual(HEkkDualRow *this,double theta)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  long *in_RDI;
  HighsSimplexAnalysis *in_XMM0_Qa;
  double dVar7;
  double local_dual_objective_change;
  double local_value;
  double delta_dual;
  HighsInt iCol;
  HighsInt i;
  double dual_objective_value_change;
  double *workDual;
  double *in_stack_ffffffffffffffa8;
  HighsSimplexAnalysis *in_stack_ffffffffffffffb0;
  int local_24;
  double local_20;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffffb0,(HighsInt)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffa8);
  pdVar3 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x7a1464);
  local_20 = 0.0;
  for (local_24 = 0; local_24 < (int)in_RDI[0xd]; local_24 = local_24 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x11),(long)local_24);
    dVar1 = *pvVar4;
    in_stack_ffffffffffffffa8 = pdVar3;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_24);
    in_stack_ffffffffffffffa8[*pvVar5] =
         -(double)in_XMM0_Qa * dVar1 + in_stack_ffffffffffffffa8[*pvVar5];
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_24);
    iVar2 = *pvVar5;
    in_stack_ffffffffffffffb0 = in_XMM0_Qa;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x11),(long)local_24);
    dVar7 = (double)in_stack_ffffffffffffffb0 * *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x25f0),(long)iVar2);
    dVar1 = *pvVar4;
    pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(*in_RDI + 0x2990),
                        (long)iVar2);
    local_20 = *(double *)(*in_RDI + 0x36e0) * (double)(int)*pvVar6 * -dVar1 * dVar7 + local_20;
  }
  *(double *)(*in_RDI + 0x2958) = local_20 + *(double *)(*in_RDI + 0x2958);
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffffb0,(HighsInt)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void HEkkDualRow::updateDual(double theta) {
  analysis->simplexTimerStart(UpdateDualClock);
  double* workDual = ekk_instance_.info_.workDual_.data();
  double dual_objective_value_change = 0;
  for (HighsInt i = 0; i < packCount; i++) {
    workDual[packIndex[i]] -= theta * packValue[i];
    // Identify the change to the dual objective
    HighsInt iCol = packIndex[i];
    const double delta_dual = theta * packValue[i];
    const double local_value = ekk_instance_.info_.workValue_[iCol];
    double local_dual_objective_change =
        ekk_instance_.basis_.nonbasicFlag_[iCol] * (-local_value * delta_dual);
    local_dual_objective_change *= ekk_instance_.cost_scale_;
    dual_objective_value_change += local_dual_objective_change;
  }
  ekk_instance_.info_.updated_dual_objective_value +=
      dual_objective_value_change;
  analysis->simplexTimerStop(UpdateDualClock);
}